

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.c
# Opt level: O2

uint32_t __thiscall nsync::nsync_counter_wait(nsync *this,nsync_counter c,nsync_time abs_deadline)

{
  int iVar1;
  uint32_t uVar2;
  nsync_time abs_deadline_00;
  nsync_waitable_s **in_stack_ffffffffffffffd0;
  nsync_waitable_s *pwaitable;
  nsync_waitable_s waitable;
  
  pwaitable = &waitable;
  waitable.funcs = (nsync_waitable_funcs_s *)nsync_counter_waitable_funcs;
  uVar2 = 0;
  abs_deadline_00.tv_nsec = 1;
  abs_deadline_00.tv_sec = abs_deadline.tv_sec;
  waitable.v = this;
  iVar1 = nsync_wait_n((nsync *)0x0,(void *)0x0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)c,
                       abs_deadline_00,(int)&pwaitable,in_stack_ffffffffffffffd0);
  if (iVar1 != 0) {
    uVar2 = *(uint32_t *)(this + 0x18);
  }
  return uVar2;
}

Assistant:

uint32_t nsync_counter_wait (nsync_counter c, nsync_time abs_deadline) {
	struct nsync_waitable_s waitable;
	struct nsync_waitable_s *pwaitable = &waitable;
	uint32_t result = 0;
	waitable.v = c;
	waitable.funcs = &nsync_counter_waitable_funcs;
	if (nsync_wait_n (NULL, NULL, NULL, abs_deadline, 1, &pwaitable) != 0) {
		IGNORE_RACES_START ();
		result = ATM_LOAD_ACQ (&c->value);
		IGNORE_RACES_END ();
	}
	return (result);
}